

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datafile.c
# Opt level: O3

errr grab_index_and_int(int *value,int *index,char **value_type,char *prefix,char *name_and_value)

{
  _Bool _Var1;
  int iVar2;
  errr eVar3;
  char *value_name;
  char *str;
  size_t sVar4;
  long lVar5;
  char *s2;
  
  value_name = string_make(name_and_value);
  str = string_make(prefix);
  lVar5 = 0;
  _Var1 = find_value_arg(value_name,(char *)0x0,0,value);
  if (_Var1) {
    s2 = *value_type;
    if (s2 != (char *)0x0) {
      lVar5 = 0;
      do {
        str = string_append(str,s2);
        iVar2 = strcmp(str,value_name);
        if (iVar2 == 0) break;
        sVar4 = strlen(prefix);
        my_strcpy(str,prefix,sVar4 + 1);
        s2 = value_type[lVar5 + 1];
        lVar5 = lVar5 + 1;
      } while (s2 != (char *)0x0);
    }
    free(str);
    free(value_name);
    if (value_type[lVar5] == (char *)0x0) {
      eVar3 = 5;
    }
    else {
      *index = (int)lVar5;
      eVar3 = 0;
    }
  }
  else {
    string_free(str);
    string_free(value_name);
    eVar3 = 0x1e;
  }
  return eVar3;
}

Assistant:

errr grab_index_and_int(int *value, int *index, const char **value_type,
						const char *prefix, const char *name_and_value)
{
	int i;
	/* Get a rewritable string */
	char *value_name = string_make(name_and_value);
	char *value_string = string_make(prefix);

	/* Parse the value expression */
	if (!find_value_arg(value_name, NULL, 0, value)) {
		string_free(value_string);
		string_free(value_name);
		return PARSE_ERROR_INVALID_VALUE;
	}

	/* Compose the value string and look for it */
	for (i = 0; value_type[i]; i++) {
		value_string = string_append(value_string, value_type[i]);
		if (streq(value_string, value_name)) break;
		my_strcpy(value_string, prefix, strlen(prefix) + 1);
	}

	free(value_string);
	free(value_name);
	if (value_type[i])
		*index = i;

	return value_type[i] ? PARSE_ERROR_NONE : PARSE_ERROR_INTERNAL;
}